

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURL_conflict * curl_easy_duphandle(Curl_easy *data)

{
  CURLcode CVar1;
  Curl_easy *dst;
  char *pcVar2;
  CookieInfo *pCVar3;
  curl_slist *pcVar4;
  Curl_easy *outcurl;
  Curl_easy *data_local;
  
  dst = (Curl_easy *)(*Curl_ccalloc)(1,0x1760);
  if (dst != (Curl_easy *)0x0) {
    (dst->set).buffer_size = (data->set).buffer_size;
    pcVar2 = (char *)(*Curl_cmalloc)((dst->set).buffer_size + 1);
    (dst->state).buffer = pcVar2;
    if ((dst->state).buffer != (char *)0x0) {
      pcVar2 = (char *)(*Curl_cmalloc)(0x100);
      (dst->state).headerbuff = pcVar2;
      if ((dst->state).headerbuff != (char *)0x0) {
        (dst->state).headersize = 0x100;
        CVar1 = dupset(dst,data);
        if (CVar1 == CURLE_OK) {
          (dst->state).conn_cache = (conncache *)0x0;
          (dst->state).lastconnect = (connectdata *)0x0;
          (dst->progress).flags = (data->progress).flags;
          (dst->progress).callback = (_Bool)((data->progress).callback & 1);
          if (data->cookies != (CookieInfo *)0x0) {
            pCVar3 = Curl_cookie_init(data,data->cookies->filename,dst->cookies,
                                      (_Bool)((data->set).cookiesession & 1));
            dst->cookies = pCVar3;
            if (dst->cookies == (CookieInfo *)0x0) goto LAB_0069bdaa;
          }
          if ((data->change).cookielist != (curl_slist *)0x0) {
            pcVar4 = Curl_slist_duplicate((data->change).cookielist);
            (dst->change).cookielist = pcVar4;
            if ((dst->change).cookielist == (curl_slist *)0x0) goto LAB_0069bdaa;
          }
          if ((data->change).url != (char *)0x0) {
            pcVar2 = (*Curl_cstrdup)((data->change).url);
            (dst->change).url = pcVar2;
            if ((dst->change).url == (char *)0x0) goto LAB_0069bdaa;
            (dst->change).url_alloc = true;
          }
          if ((data->change).referer != (char *)0x0) {
            pcVar2 = (*Curl_cstrdup)((data->change).referer);
            (dst->change).referer = pcVar2;
            if ((dst->change).referer == (char *)0x0) goto LAB_0069bdaa;
            (dst->change).referer_alloc = true;
          }
          if (((dst->set).str[0x2b] == (char *)0x0) ||
             (CVar1 = Curl_ssl_set_engine(dst,(dst->set).str[0x2b]), CVar1 == CURLE_OK)) {
            Curl_initinfo(dst);
            dst->magic = 0xc0dedbad;
            return dst;
          }
        }
      }
    }
  }
LAB_0069bdaa:
  if (dst != (Curl_easy *)0x0) {
    curl_slist_free_all((dst->change).cookielist);
    (dst->change).cookielist = (curl_slist *)0x0;
    (*Curl_cfree)((dst->state).buffer);
    (dst->state).buffer = (char *)0x0;
    (*Curl_cfree)((dst->state).headerbuff);
    (dst->state).headerbuff = (char *)0x0;
    (*Curl_cfree)((dst->change).url);
    (dst->change).url = (char *)0x0;
    (*Curl_cfree)((dst->change).referer);
    (dst->change).referer = (char *)0x0;
    Curl_freeset(dst);
    (*Curl_cfree)(dst);
  }
  return (CURL_conflict *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_duphandle(struct Curl_easy *data)
{
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(NULL == outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;
  outcurl->state.buffer = malloc(outcurl->set.buffer_size + 1);
  if(!outcurl->state.buffer)
    goto fail;

  outcurl->state.headerbuff = malloc(HEADERSIZE);
  if(!outcurl->state.headerbuff)
    goto fail;
  outcurl->state.headersize = HEADERSIZE;

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;

  outcurl->state.lastconnect = NULL;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

  if(data->cookies) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(data,
                                        data->cookies->filename,
                                        outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  /* duplicate all values in 'change' */
  if(data->change.cookielist) {
    outcurl->change.cookielist =
      Curl_slist_duplicate(data->change.cookielist);
    if(!outcurl->change.cookielist)
      goto fail;
  }

  if(data->change.url) {
    outcurl->change.url = strdup(data->change.url);
    if(!outcurl->change.url)
      goto fail;
    outcurl->change.url_alloc = TRUE;
  }

  if(data->change.referer) {
    outcurl->change.referer = strdup(data->change.referer);
    if(!outcurl->change.referer)
      goto fail;
    outcurl->change.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(&outcurl->state.resolver,
                             data->state.resolver))
    goto fail;

  Curl_convert_setup(outcurl);

  Curl_initinfo(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

  fail:

  if(outcurl) {
    curl_slist_free_all(outcurl->change.cookielist);
    outcurl->change.cookielist = NULL;
    Curl_safefree(outcurl->state.buffer);
    Curl_safefree(outcurl->state.headerbuff);
    Curl_safefree(outcurl->change.url);
    Curl_safefree(outcurl->change.referer);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}